

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

AssertionResult __thiscall
testing::internal::CmpHelperFloatingPointEQ<double>
          (internal *this,char *lhs_expression,char *rhs_expression,double lhs_value,
          double rhs_value)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  AssertionResult AVar3;
  stringstream local_3a0 [8];
  stringstream lhs_ss;
  long local_390;
  undefined8 auStack_388 [13];
  ios_base aiStack_320 [264];
  stringstream local_218 [8];
  stringstream rhs_ss;
  long local_208;
  undefined8 auStack_200 [13];
  ios_base aiStack_198 [264];
  FloatingPointUnion local_90;
  FloatingPoint<double> lhs;
  FloatingPoint<double> rhs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  string local_60;
  double local_40;
  double local_38;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  local_90.value_ = lhs_value;
  lhs.u_ = (FloatingPointUnion)rhs_value;
  local_40 = lhs_value;
  local_38 = rhs_value;
  bVar1 = FloatingPoint<double>::AlmostEquals((FloatingPoint<double> *)&local_90,&lhs);
  if (bVar1) {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_3a0);
    *(undefined8 *)((long)auStack_388 + *(long *)(local_390 + -0x18)) = 0x11;
    std::ostream::_M_insert<double>(local_40);
    std::__cxx11::stringstream::stringstream(local_218);
    *(undefined8 *)((long)auStack_200 + *(long *)(local_208 + -0x18)) = 0x11;
    std::ostream::_M_insert<double>(local_38);
    StringStreamToString((string *)&rhs,(stringstream *)local_3a0);
    StringStreamToString(&local_60,(stringstream *)local_218);
    EqFailure(this,lhs_expression,rhs_expression,(string *)&rhs,&local_60,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (rhs.u_ != (FloatingPointUnion)&local_70) {
      operator_delete((void *)rhs.u_,local_70._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_218);
    std::ios_base::~ios_base(aiStack_198);
    std::__cxx11::stringstream::~stringstream(local_3a0);
    std::ios_base::~ios_base(aiStack_320);
    sVar2.ptr_ = extraout_RDX;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperFloatingPointEQ(const char* lhs_expression,
                                         const char* rhs_expression,
                                         RawType lhs_value,
                                         RawType rhs_value) {
  const FloatingPoint<RawType> lhs(lhs_value), rhs(rhs_value);

  if (lhs.AlmostEquals(rhs)) {
    return AssertionSuccess();
  }

  ::std::stringstream lhs_ss;
  lhs_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
         << lhs_value;

  ::std::stringstream rhs_ss;
  rhs_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
         << rhs_value;

  return EqFailure(lhs_expression,
                   rhs_expression,
                   StringStreamToString(&lhs_ss),
                   StringStreamToString(&rhs_ss),
                   false);
}